

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FieldOptions_FeatureSupport::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  FieldOptions_FeatureSupport *this;
  MessageLite *value;
  FieldOptions_FeatureSupport **v1;
  FieldOptions_FeatureSupport **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  Arena *arena;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  FieldOptions_FeatureSupport *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldOptions_FeatureSupport *from;
  FieldOptions_FeatureSupport *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  FieldOptions_FeatureSupport *local_18;
  anon_union_32_1_493b367e_for_FieldOptions_FeatureSupport_3 *local_10;
  
  local_50 = (FieldOptions_FeatureSupport *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (FieldOptions_FeatureSupport *)to_msg;
  _this = (FieldOptions_FeatureSupport *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FieldOptions_FeatureSupport_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FieldOptions_FeatureSupport*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FieldOptions_FeatureSupport_const*,google::protobuf::FieldOptions_FeatureSupport*>
                       (v1,v2,"&from != _this");
  if (local_48 == (Nullable<const_char_*>)0x0) {
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    this = from;
    uVar1 = *puVar3;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        to_msg_local = (MessageLite *)
                       _internal_deprecation_warning_abi_cxx11_
                                 ((FieldOptions_FeatureSupport *)absl_log_internal_check_op_result);
        local_18 = this;
        local_10 = &this->field_0;
        puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
        value = to_msg_local;
        *puVar3 = *puVar3 | 1;
        arena = MessageLite::GetArena((MessageLite *)this);
        internal::ArenaStringPtr::Set<>
                  (&(this->field_0)._impl_.deprecation_warning_,(string *)value,arena);
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.edition_introduced_ =
             *(int *)(absl_log_internal_check_op_result + 0x20);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.edition_deprecated_ =
             *(int *)(absl_log_internal_check_op_result + 0x24);
      }
      if ((uVar1 & 8) != 0) {
        (from->field_0)._impl_.edition_removed_ = *(int *)(absl_log_internal_check_op_result + 0x28)
        ;
      }
    }
    puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x2668,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

void FieldOptions_FeatureSupport::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldOptions_FeatureSupport*>(&to_msg);
  auto& from = static_cast<const FieldOptions_FeatureSupport&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldOptions.FeatureSupport)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_deprecation_warning(from._internal_deprecation_warning());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.edition_introduced_ = from._impl_.edition_introduced_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.edition_deprecated_ = from._impl_.edition_deprecated_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.edition_removed_ = from._impl_.edition_removed_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}